

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreaction.cc
# Opt level: O2

void ActionStackPtrFlow::analyzeExtraPop(Funcdata *data,AddrSpace *stackspace,int4 spcbase)

{
  int iVar1;
  int4 s;
  PcodeOp *op;
  Varnode *pVVar2;
  bool bVar3;
  ProtoModel *pPVar4;
  FuncCallSpecs *pFVar5;
  int iVar6;
  long lVar7;
  bool bVar8;
  Varnode *local_260;
  Varnode *invn;
  StackSolver solver;
  vector<Varnode_*,_std::allocator<Varnode_*>_> paramlist;
  
  pPVar4 = data->glb->evalfp_called;
  if (pPVar4 == (ProtoModel *)0x0) {
    pPVar4 = data->glb->defaultfp;
  }
  if (pPVar4->extrapop == 0x8000) {
    solver.soln.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    solver.soln.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    solver.soln.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    solver.eqs.super__Vector_base<StackEqn,_std::allocator<StackEqn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    solver.eqs.super__Vector_base<StackEqn,_std::allocator<StackEqn>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    solver.eqs.super__Vector_base<StackEqn,_std::allocator<StackEqn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    solver.guess.super__Vector_base<StackEqn,_std::allocator<StackEqn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    solver.guess.super__Vector_base<StackEqn,_std::allocator<StackEqn>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    solver.guess.super__Vector_base<StackEqn,_std::allocator<StackEqn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    solver.vnlist.super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    solver.vnlist.super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    solver.vnlist.super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    solver.companion.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    solver.companion.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    solver.companion.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    solver.spacebase.base = (AddrSpace *)0x0;
    StackSolver::build(&solver,data,stackspace,spcbase);
    if ((int)((ulong)((long)solver.vnlist.super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)solver.vnlist.super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                           _M_impl.super__Vector_impl_data._M_start) >> 3) != 0) {
      StackSolver::solve(&solver);
      invn = *solver.vnlist.super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
              super__Vector_impl_data._M_start;
      bVar8 = false;
      for (lVar7 = 1;
          lVar7 < (int)((ulong)((long)solver.vnlist.
                                      super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                                      _M_impl.super__Vector_impl_data._M_finish -
                               (long)solver.vnlist.
                                     super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                                     _M_impl.super__Vector_impl_data._M_start) >> 3);
          lVar7 = lVar7 + 1) {
        iVar1 = solver.soln.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar7];
        if ((long)iVar1 == 0xffff) {
          bVar3 = !bVar8;
          bVar8 = true;
          if (bVar3) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &paramlist,"Unable to track spacebase fully for ",&stackspace->name);
            Funcdata::warningHeader
                      (data,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &paramlist);
            std::__cxx11::string::~string((string *)&paramlist);
          }
        }
        else {
          op = solver.vnlist.super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
               super__Vector_impl_data._M_start[lVar7]->def;
          if ((op->opcode->opcode == CPUI_INDIRECT) &&
             (pVVar2 = (op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                       _M_impl.super__Vector_impl_data._M_start[1],
             ((pVVar2->loc).base)->type == IPTR_IOP)) {
            pFVar5 = Funcdata::getCallSpecs(data,(PcodeOp *)(pVVar2->loc).offset);
            if (pFVar5 != (FuncCallSpecs *)0x0) {
              if ((long)solver.companion.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar7] < 0) {
                iVar6 = 0;
              }
              else {
                iVar6 = solver.soln.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start
                        [solver.companion.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar7]];
              }
              pFVar5->effective_extrapop = iVar1 - iVar6;
            }
          }
          paramlist.super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          paramlist.super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          paramlist.super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<Varnode_*,_std::allocator<Varnode_*>_>::push_back(&paramlist,&invn);
          s = invn->size;
          iVar6 = 8;
          if (s < 8) {
            iVar6 = s;
          }
          local_260 = Funcdata::newConstant(data,s,(long)iVar1 & uintbmasks[iVar6]);
          std::vector<Varnode*,std::allocator<Varnode*>>::emplace_back<Varnode*>
                    ((vector<Varnode*,std::allocator<Varnode*>> *)&paramlist,&local_260);
          Funcdata::opSetOpcode(data,op,CPUI_INT_ADD);
          Funcdata::opSetAllInput(data,op,&paramlist);
          std::_Vector_base<Varnode_*,_std::allocator<Varnode_*>_>::~_Vector_base
                    ((_Vector_base<Varnode_*,_std::allocator<Varnode_*>_> *)&paramlist);
        }
      }
    }
    StackSolver::~StackSolver(&solver);
  }
  return;
}

Assistant:

void ActionStackPtrFlow::analyzeExtraPop(Funcdata &data,AddrSpace *stackspace,int4 spcbase)

{
  ProtoModel *myfp = data.getArch()->evalfp_called;
  if (myfp == (ProtoModel *)0)
    myfp = data.getArch()->defaultfp;
  if (myfp->getExtraPop()!=ProtoModel::extrapop_unknown) return;

  StackSolver solver;
  try {
    solver.build(data,stackspace,spcbase);
  } catch(LowlevelError &err) {
    ostringstream s;
    s << "Stack frame is not setup normally: " << err.explain;
    data.warningHeader(s.str());
    return;
  }
  if (solver.getNumVariables() == 0) return;
  solver.solve();		// Solve the equations
  
  Varnode *invn = solver.getVariable(0);
  bool warningprinted = false;

  for(int4 i=1;i<solver.getNumVariables();++i) {
    Varnode *vn = solver.getVariable(i);
    int4 soln = solver.getSolution(i);
    if (soln == 65535) {
      if (!warningprinted) {
	data.warningHeader("Unable to track spacebase fully for "+stackspace->getName());
	warningprinted = true;
      }
      continue;
    }
    PcodeOp *op = vn->getDef();

    if (op->code() == CPUI_INDIRECT) {
      Varnode *iopvn = op->getIn(1);
      if (iopvn->getSpace()->getType()==IPTR_IOP) {
	PcodeOp *iop = PcodeOp::getOpFromConst(iopvn->getAddr());
	FuncCallSpecs *fc = data.getCallSpecs(iop);
	if (fc != (FuncCallSpecs *)0) {
	  int4 soln2 = 0;
	  int4 comp = solver.getCompanion(i);
	  if (comp >= 0)
	    soln2 = solver.getSolution(comp);
	  fc->setEffectiveExtraPop(soln-soln2);
	}
      }
    }
    vector<Varnode *> paramlist;
    paramlist.push_back(invn);
    int4 sz = invn->getSize();
    paramlist.push_back(data.newConstant(sz,soln&calc_mask(sz)));
    data.opSetOpcode(op,CPUI_INT_ADD);
    data.opSetAllInput(op,paramlist);
  }
  return;
}